

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::SelectionSet::countBits
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,SelectionSet *this)

{
  uint in_EAX;
  int iVar1;
  int i;
  long lVar2;
  long lVar3;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,6,(value_type_conflict2 *)((long)&uStack_28 + 4),
             (allocator_type *)((long)&uStack_28 + 3));
  lVar3 = 0;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    iVar1 = OpenMDBitSet::countBits
                      ((OpenMDBitSet *)
                       ((long)&(((this->bitsets_).
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_> + lVar3));
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar2] = iVar1;
    lVar3 = lVar3 + 0x28;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> SelectionSet::countBits() {
    std::vector<int> result(N_SELECTIONTYPES, 0);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].countBits();
    return result;
  }